

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu382.c
# Opt level: O0

MPP_RET hal_avs2d_vdpu382_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MppDev ctx;
  Vdpu382Avs2dRegSet *local_68;
  Vdpu382RegAvs2dParam *local_60;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  Avs2dHalCtx_t *p_hal;
  MppDev dev;
  Avs2dVdpu382RegCtx_t *reg_ctx;
  Vdpu382Avs2dRegSet *regs;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","In.","hal_avs2d_vdpu382_start");
  }
  if (hal == (void *)0x0) {
    regs._4_4_ = MPP_ERR_INIT;
    if ((avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","input empty(%d).\n",(char *)0x0,0x36a);
    }
  }
  else if (((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) ||
          (*(int *)(*(long *)((long)hal + 8) + 0x30) != 0)) {
    lVar1 = *(long *)((long)hal + 0x5a8);
    if (*(int *)((long)hal + 0x5a0) == 0) {
      local_68 = *(Vdpu382Avs2dRegSet **)(lVar1 + 0x50);
    }
    else {
      local_68 = *(Vdpu382Avs2dRegSet **)(lVar1 + (long)(task->dec).reg_index * 0x18 + 0x10);
    }
    ctx = *(MppDev *)((long)hal + 0x40);
    *(int *)((long)hal + 0x5c0) = *(int *)((long)hal + 0x5c0) + 1;
    rd_cfg._8_8_ = local_68;
    regs._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
    if (regs._4_4_ == MPP_OK) {
      rd_cfg._8_8_ = &local_68->avs2d_param;
      regs._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
      if (regs._4_4_ == MPP_OK) {
        rd_cfg._8_8_ = &local_68->common_addr;
        regs._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
        if (regs._4_4_ == MPP_OK) {
          rd_cfg._8_8_ = &local_68->avs2d_addr;
          regs._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
          if (regs._4_4_ == MPP_OK) {
            rd_cfg._8_8_ = &local_68->statistic;
            regs._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
            if (regs._4_4_ == MPP_OK) {
              local_60 = (Vdpu382RegAvs2dParam *)&local_68->irq_status;
              rd_cfg.reg._0_4_ = 0x38;
              rd_cfg.reg._4_4_ = 0x380;
              regs._4_4_ = mpp_dev_ioctl(ctx,5,&local_60);
              if (regs._4_4_ == MPP_OK) {
                local_60 = &local_68->avs2d_param;
                rd_cfg.reg._0_4_ = 0xc4;
                rd_cfg.reg._4_4_ = 0x100;
                regs._4_4_ = mpp_dev_ioctl(ctx,5,&local_60);
                if (regs._4_4_ == MPP_OK) {
                  local_60 = (Vdpu382RegAvs2dParam *)&local_68->statistic;
                  rd_cfg.reg._0_4_ = 0x58;
                  rd_cfg.reg._4_4_ = 0x400;
                  regs._4_4_ = mpp_dev_ioctl(ctx,5,&local_60);
                  if (regs._4_4_ == MPP_OK) {
                    if ((avs2d_hal_debug & 0x200) != 0) {
                      memset((void *)(lVar1 + 0x284),0,0x458);
                      local_60 = (Vdpu382RegAvs2dParam *)(lVar1 + 0x284);
                      rd_cfg.reg._0_4_ = 0x458;
                      rd_cfg.reg._4_4_ = 0;
                      mpp_dev_ioctl(ctx,5,&local_60);
                    }
                    vdpu382_set_rcbinfo(ctx,(Vdpu382RcbInfo *)(lVar1 + 0x20c));
                    if ((avs2d_hal_debug & 0x400) != 0) {
                      hal_avs2d_vdpu382_dump_stream(hal,task);
                    }
                    if ((avs2d_hal_debug & 0x200) != 0) {
                      hal_avs2d_vdpu382_dump_reg_write(hal,local_68);
                    }
                    regs._4_4_ = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
                    if (regs._4_4_ != MPP_OK) {
                      _mpp_log_l(2,"hal_avs2d_vdpu382","send cmd failed %d\n",
                                 "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
                    }
                  }
                  else {
                    _mpp_log_l(2,"hal_avs2d_vdpu382","set register write failed %d\n",
                               "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
                  }
                }
                else {
                  _mpp_log_l(2,"hal_avs2d_vdpu382","set register read failed %d\n",
                             "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
                }
              }
              else {
                _mpp_log_l(2,"hal_avs2d_vdpu382","set register read failed %d\n",
                           "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"hal_avs2d_vdpu382","set register write failed %d\n",
                         "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"hal_avs2d_vdpu382","set register write failed %d\n",
                       "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_avs2d_vdpu382","set register write failed %d\n",
                     "hal_avs2d_vdpu382_start",(ulong)(uint)regs._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_avs2d_vdpu382","set register write failed %d\n","hal_avs2d_vdpu382_start",
                   (ulong)(uint)regs._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_avs2d_vdpu382","set register write failed %d\n","hal_avs2d_vdpu382_start",
                 (ulong)(uint)regs._4_4_);
    }
  }
  else {
    regs._4_4_ = MPP_NOK;
  }
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","Out.","hal_avs2d_vdpu382_start");
  }
  return regs._4_4_;
}

Assistant:

MPP_RET hal_avs2d_vdpu382_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    Vdpu382Avs2dRegSet *regs = NULL;
    Avs2dVdpu382RegCtx_t *reg_ctx;
    MppDev dev = NULL;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    AVS2D_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == p_hal);

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->cfg->base.disable_error) {
        ret = MPP_NOK;
        goto __RETURN;
    }

    reg_ctx = (Avs2dVdpu382RegCtx_t *)p_hal->reg_ctx;
    regs = p_hal->fast_mode ? reg_ctx->reg_buf[task->dec.reg_index].regs : reg_ctx->regs;
    dev = p_hal->dev;

    p_hal->frame_no++;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->common;
        wr_cfg.size = sizeof(regs->common);
        wr_cfg.offset = OFFSET_COMMON_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->avs2d_param;
        wr_cfg.size = sizeof(regs->avs2d_param);
        wr_cfg.offset = OFFSET_CODEC_PARAMS_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->common_addr;
        wr_cfg.size = sizeof(regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->avs2d_addr;
        wr_cfg.size = sizeof(regs->avs2d_addr);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->statistic;
        wr_cfg.size = sizeof(regs->statistic);
        wr_cfg.offset = OFFSET_STATISTIC_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->irq_status;
        rd_cfg.size = sizeof(regs->irq_status);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->avs2d_param;
        rd_cfg.size = sizeof(regs->avs2d_param);
        rd_cfg.offset = OFFSET_CODEC_PARAMS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->statistic;
        rd_cfg.size = sizeof(regs->statistic);
        rd_cfg.offset = OFFSET_STATISTIC_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        if (avs2d_hal_debug & AVS2D_HAL_DBG_REG) {
            memset(reg_ctx->reg_out, 0, sizeof(reg_ctx->reg_out));
            rd_cfg.reg = reg_ctx->reg_out;
            rd_cfg.size = sizeof(reg_ctx->reg_out);
            rd_cfg.offset = 0;
            ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        }

        // rcb info for sram
        vdpu382_set_rcbinfo(dev, reg_ctx->rcb_info);

        if (avs2d_hal_debug & AVS2D_HAL_DBG_IN)
            hal_avs2d_vdpu382_dump_stream(hal, task);

        if (avs2d_hal_debug & AVS2D_HAL_DBG_REG)
            hal_avs2d_vdpu382_dump_reg_write(hal, regs);

        // send request to hardware
        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }

    } while (0);

__RETURN:
    AVS2D_HAL_TRACE("Out.");
    return ret;
}